

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::computeVertexNormals(SurfaceMesh *this)

{
  undefined8 uVar1;
  vec<3,_float,_(glm::qualifier)0> *pvVar2;
  reference pvVar3;
  reference pvVar4;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *pMVar5;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [56];
  vec<3,_float,_(glm::qualifier)0> vVar8;
  ManagedBuffer<float> *unaff_retaddr;
  size_t iV_1;
  size_t iV;
  size_t j;
  size_t D;
  size_t start;
  size_t iF;
  vec3 zero;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffff38;
  vec<3,_float,_(glm::qualifier)0> *in_stack_ffffffffffffff40;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this_00;
  __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  in_stack_ffffffffffffff50;
  vec<3,_float,_(glm::qualifier)0> *x;
  pointer __new_size;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_78;
  vec<3,_float,_(glm::qualifier)0> local_5c;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  vec<3,_float,_(glm::qualifier)0> *local_30;
  vec<3,_float,_(glm::qualifier)0> *local_28;
  vec<3,_float,_(glm::qualifier)0> *local_20;
  vec<3,float,(glm::qualifier)0> local_14 [20];
  float scalar;
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)unaff_retaddr);
  render::ManagedBuffer<float>::ensureHostBufferPopulated(unaff_retaddr);
  __new_size = in_RDI[0xa4].
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  nVertices((SurfaceMesh *)0x46a2df);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(in_RDI,(size_type)__new_size);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_14,0.0,0.0,0.0);
  local_20 = (vec<3,_float,_(glm::qualifier)0> *)
             std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::begin(in_stack_ffffffffffffff38);
  local_28 = (vec<3,_float,_(glm::qualifier)0> *)
             std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::end(in_stack_ffffffffffffff38);
  std::
  fill<__gnu_cxx::__normal_iterator<glm::vec<3,float,(glm::qualifier)0>*,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>,glm::vec<3,float,(glm::qualifier)0>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  local_30 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  while( true ) {
    x = local_30;
    pvVar2 = (vec<3,_float,_(glm::qualifier)0> *)nFaces((SurfaceMesh *)0x46a37a);
    if (pvVar2 <= x) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &in_RDI[0x2c].
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(size_type)local_30);
    local_38 = (ulong)*pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &in_RDI[0x2c].
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                        (size_type)((long)&local_30->field_0 + 1));
    local_40 = *pvVar3 - local_38;
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &in_RDI[0x2d].
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_38 + local_48);
      local_50 = (ulong)*pvVar3;
      pvVar4 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)in_RDI[0x87].
                               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (size_type)local_30);
      scalar = (float)((ulong)pvVar4 >> 0x20);
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)
                 in_RDI[0x9b].
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,(size_type)local_30);
      auVar7 = (undefined1  [56])0x0;
      vVar8 = glm::operator*(x,scalar);
      local_5c.field_2 = vVar8.field_2;
      auVar6._0_8_ = vVar8._0_8_;
      auVar6._8_56_ = auVar7;
      local_5c._0_8_ = vmovlpd_avx(auVar6._0_16_);
      pvVar4 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)in_RDI[0xa4].
                               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
      glm::vec<3,float,(glm::qualifier)0>::operator+=
                ((vec<3,float,(glm::qualifier)0> *)pvVar4,&local_5c);
    }
    local_30 = (vec<3,_float,_(glm::qualifier)0> *)((long)&local_30->field_0 + 1);
  }
  local_78 = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x0;
  while( true ) {
    auVar7 = auVar6._8_56_;
    this_00 = local_78;
    pMVar5 = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             nVertices((SurfaceMesh *)0x46a507);
    if (pMVar5 <= this_00) break;
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  *)in_RDI[0xa4].
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)local_78);
    vVar8 = glm::normalize<3,float,(glm::qualifier)0>(x);
    auVar6._0_8_ = vVar8._0_8_;
    auVar6._8_56_ = auVar7;
    uVar1 = vmovlpd_avx(auVar6._0_16_);
    pvVar4 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)in_RDI[0xa4].
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)local_78)
    ;
    pvVar4->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
    pvVar4->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20)
    ;
    pvVar4->field_2 = vVar8.field_2;
    local_78 = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
               ((long)&local_78->_vptr_ManagedBuffer + 1);
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated(this_00);
  return;
}

Assistant:

void SurfaceMesh::computeVertexNormals() {

  faceNormals.ensureHostBufferPopulated();
  faceAreas.ensureHostBufferPopulated();

  vertexNormals.data.resize(nVertices());

  const glm::vec3 zero{0., 0., 0.};

  std::fill(vertexNormals.data.begin(), vertexNormals.data.end(), zero);

  // Accumulate quantities from each face
  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t start = faceIndsStart[iF];
    size_t D = faceIndsStart[iF + 1] - start;
    for (size_t j = 0; j < D; j++) {
      size_t iV = faceIndsEntries[start + j];
      vertexNormals.data[iV] += faceNormals.data[iF] * static_cast<float>(faceAreas.data[iF]);
    }
  }

  // Normalize
  for (size_t iV = 0; iV < nVertices(); iV++) {
    vertexNormals.data[iV] = glm::normalize(vertexNormals.data[iV]);
  }

  vertexNormals.markHostBufferUpdated();
}